

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

method_info * __thiscall
Frame::getMethodNamed(Frame *this,ClassRuntime *classRuntime,string *name,string *descriptor)

{
  method_info *pmVar1;
  bool bVar2;
  __type _Var3;
  ClassFile *pCVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  allocator local_a1;
  method_info *local_a0;
  MethodArea *local_98;
  Frame *local_90;
  ClassRuntime *local_88;
  string *local_80;
  string *local_78;
  string methodDesc;
  string methodName;
  
  local_90 = this;
  local_80 = descriptor;
  local_78 = name;
  local_98 = MethodArea::getInstance();
  do {
    uVar6 = 0xffffffffffffffff;
    if (classRuntime == (ClassRuntime *)0x0) {
      return (method_info *)0x0;
    }
    local_88 = classRuntime;
    pCVar4 = ClassRuntime::getClassFile(classRuntime);
    lVar7 = 0;
    while (uVar6 = uVar6 + 1, uVar6 < pCVar4->methods_count) {
      pmVar1 = pCVar4->methods;
      pcVar5 = getFormattedConstant
                         (pCVar4->constant_pool,*(u2 *)((long)&pmVar1->name_index + lVar7));
      std::__cxx11::string::string((string *)&methodName,pcVar5,(allocator *)&methodDesc);
      pcVar5 = getFormattedConstant
                         (pCVar4->constant_pool,*(u2 *)((long)&pmVar1->descriptor_index + lVar7));
      std::__cxx11::string::string((string *)&methodDesc,pcVar5,&local_a1);
      _Var3 = std::operator==(&methodName,local_78);
      bVar2 = true;
      if ((_Var3) && (_Var3 = std::operator==(&methodDesc,local_80), _Var3)) {
        local_a0 = (method_info *)((long)&pmVar1->access_flags + lVar7);
        local_90->_classRuntime = local_88;
        bVar2 = false;
      }
      lVar7 = lVar7 + 0x10;
      std::__cxx11::string::~string((string *)&methodDesc);
      std::__cxx11::string::~string((string *)&methodName);
      if (!bVar2) {
        return local_a0;
      }
    }
    classRuntime = (ClassRuntime *)0x0;
    if (pCVar4->super_class != 0) {
      pcVar5 = getFormattedConstant(pCVar4->constant_pool,pCVar4->super_class);
      std::__cxx11::string::string((string *)&methodName,pcVar5,(allocator *)&methodDesc);
      classRuntime = MethodArea::loadClassNamed(local_98,&methodName);
      std::__cxx11::string::~string((string *)&methodName);
    }
  } while( true );
}

Assistant:

method_info* Frame::getMethodNamed(ClassRuntime *classRuntime, string name, string descriptor) {
    MethodArea &methodArea = MethodArea::getInstance();
    
    ClassRuntime *currClass = classRuntime;
    method_info *method;
    
    while (currClass != NULL) {
        ClassFile *classFile = currClass->getClassFile();
        
        for (int i = 0; i < classFile->methods_count; i++) {
            method = &(classFile->methods[i]);
            string methodName = getFormattedConstant(classFile->constant_pool, method->name_index);
            string methodDesc = getFormattedConstant(classFile->constant_pool, method->descriptor_index);
            
            if (methodName == name && methodDesc == descriptor) {
                _classRuntime = currClass;
                return method;
            }
        }
        
        // procurando o método nas super classes.
        if (classFile->super_class == 0) {
            currClass = NULL;
        } else {
            string superClassName = getFormattedConstant(classFile->constant_pool, classFile->super_class);
            currClass = methodArea.loadClassNamed(superClassName);
        }
    }
    
    return NULL;
}